

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  ostream *poVar1;
  ColourImpl *pCVar2;
  Version *version;
  size_type in_RCX;
  StringRef str;
  ColourGuard local_28;
  lineOfChars local_11;
  ConsoleReporter *local_10;
  ConsoleReporter *this_local;
  
  local_10 = this;
  poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  lineOfChars::lineOfChars(&local_11,'~');
  poVar1 = Catch::operator<<(poVar1,local_11);
  poVar1 = std::operator<<(poVar1,'\n');
  pCVar2 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                     (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
  ColourImpl::guardColour((ColourImpl *)&local_28,(Code)pCVar2);
  poVar1 = Catch::operator<<(poVar1,&local_28);
  str.m_size = in_RCX;
  str.m_start = (char *)(this->super_StreamingReporterBase).currentTestRunInfo.name.m_size;
  poVar1 = Catch::operator<<((Catch *)poVar1,
                             (ostream *)
                             (this->super_StreamingReporterBase).currentTestRunInfo.name.m_start,str
                            );
  poVar1 = std::operator<<(poVar1," is a Catch2 v");
  version = libraryVersion();
  poVar1 = Catch::operator<<(poVar1,version);
  poVar1 = std::operator<<(poVar1," host application.\n");
  std::operator<<(poVar1,"Run with -? for options\n\n");
  ColourImpl::ColourGuard::~ColourGuard(&local_28);
  this->m_testRunInfoPrinted = true;
  return;
}

Assistant:

void ConsoleReporter::lazyPrintRunInfo() {
    m_stream << '\n'
             << lineOfChars( '~' ) << '\n'
             << m_colour->guardColour( Colour::SecondaryText )
             << currentTestRunInfo.name << " is a Catch2 v" << libraryVersion()
             << " host application.\n"
             << "Run with -? for options\n\n";

    m_testRunInfoPrinted = true;
}